

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::DictionaryFeatureType::MergeFrom
          (DictionaryFeatureType *this,DictionaryFeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  StringFeatureType *this_00;
  Int64FeatureType *this_01;
  StringFeatureType *from_00;
  Int64FeatureType *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/FeatureTypes.pb.cc"
               ,0xeae);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] != 1) {
    if (from->_oneof_case_[0] != 2) {
      return;
    }
    if (this->_oneof_case_[0] == 2) {
      this_00 = (this->KeyType_).stringkeytype_;
    }
    else {
      clear_KeyType(this);
      this->_oneof_case_[0] = 2;
      this_00 = (StringFeatureType *)operator_new(0x18);
      StringFeatureType::StringFeatureType(this_00);
      (this->KeyType_).stringkeytype_ = this_00;
      if (from->_oneof_case_[0] != 2) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_00 = (StringFeatureType *)&_StringFeatureType_default_instance_;
        goto LAB_001ca320;
      }
    }
    from_00 = (from->KeyType_).stringkeytype_;
LAB_001ca320:
    StringFeatureType::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 1) {
    this_01 = (this->KeyType_).int64keytype_;
  }
  else {
    clear_KeyType(this);
    this->_oneof_case_[0] = 1;
    this_01 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_01);
    (this->KeyType_).int64keytype_ = this_01;
    if (from->_oneof_case_[0] != 1) {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
      goto LAB_001ca336;
    }
  }
  from_01 = (from->KeyType_).int64keytype_;
LAB_001ca336:
  Int64FeatureType::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void DictionaryFeatureType::MergeFrom(const DictionaryFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictionaryFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.KeyType_case()) {
    case kInt64KeyType: {
      mutable_int64keytype()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64keytype());
      break;
    }
    case kStringKeyType: {
      mutable_stringkeytype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringkeytype());
      break;
    }
    case KEYTYPE_NOT_SET: {
      break;
    }
  }
}